

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_slider.c
# Opt level: O0

int slider_newclick(t_gobj *z,_glist *glist,int xpix,int ypix,int shift,int alt,int dbl,int doit)

{
  t_slider *x;
  int alt_local;
  int shift_local;
  int ypix_local;
  int xpix_local;
  _glist *glist_local;
  t_gobj *z_local;
  
  if (doit != 0) {
    slider_click((t_slider *)z,(float)xpix,(float)ypix,(float)shift,0.0,(float)alt);
    if (shift == 0) {
      *(uint *)&z[0x44].g_pd = *(uint *)&z[0x44].g_pd & 0xfdffffff;
    }
    else {
      *(uint *)&z[0x44].g_pd = *(uint *)&z[0x44].g_pd & 0xfdffffff | 0x2000000;
    }
  }
  return 1;
}

Assistant:

static int slider_newclick(t_gobj *z, struct _glist *glist,
    int xpix, int ypix, int shift, int alt, int dbl, int doit)
{
    t_slider* x = (t_slider *)z;

    if(doit)
    {
        slider_click(x, (t_floatarg)xpix, (t_floatarg)ypix, (t_floatarg)shift,
            0, (t_floatarg)alt);
        if(shift)
            x->x_gui.x_fsf.x_finemoved = 1;
        else
            x->x_gui.x_fsf.x_finemoved = 0;
    }
    return (1);
}